

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_fmt::v10::basic_string_view<char>,_char[3]>
* fmt::v10::
  make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,fmt::v10::basic_string_view<char>,char_const[3]>
            (basic_string_view<char> *args,char (*args_1) [3])

{
  size_t sVar1;
  size_t in_RDX;
  undefined8 *in_RSI;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_fmt::v10::basic_string_view<char>,_char[3]>
  *in_RDI;
  basic_string_view<char> s;
  bool formattable;
  bool formattable_pointer;
  bool formattable_char;
  bool formattable_1;
  bool formattable_pointer_1;
  bool formattable_char_1;
  undefined1 local_d9;
  char *local_d8;
  size_t local_d0;
  undefined1 local_c3;
  undefined1 local_c2;
  undefined1 local_c1;
  char *local_b8 [5];
  size_t local_90;
  detail *local_68;
  char *pcStack_60;
  undefined1 *local_50;
  basic_string_view<char> local_48;
  char **local_38;
  basic_string_view<char> local_30 [3];
  
  local_c1 = 1;
  local_c2 = 1;
  local_c3 = 1;
  local_50 = &local_d9;
  local_68 = (detail *)*in_RSI;
  pcStack_60 = (char *)in_RSI[1];
  s.size_ = in_RDX;
  s.data_ = pcStack_60;
  local_48 = detail::to_string_view<char>(local_68,s);
  local_d8 = local_48.data_;
  local_d0 = local_48.size_;
  local_30[0].data_ = local_48.data_;
  local_30[0].size_ = local_48.size_;
  local_38 = local_b8;
  local_b8[0] = basic_string_view<char>::data(local_30);
  sVar1 = basic_string_view<char>::size(local_30);
  (in_RDI->data_).args_[0].field_0.string.data = local_b8[0];
  (in_RDI->data_).args_[0].field_0.string.size = sVar1;
  (in_RDI->data_).args_[1].field_0.long_long_value = in_RDX;
  (in_RDI->data_).args_[1].field_0.string.size = local_90;
  return in_RDI;
}

Assistant:

constexpr auto make_format_args(T&... args)
    -> format_arg_store<Context, remove_cvref_t<T>...> {
  return {args...};
}